

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O3

bool google::protobuf::compiler::objectivec::ValidateObjCClassPrefixes
               (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *files,Options *validation_options,string *out_error)

{
  uint uVar1;
  pointer pcVar2;
  FileDescriptor *pFVar3;
  _Alloc_hider _Var4;
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  anon_union_8_1_a8a14541_for_iterator_2 aVar10;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  pointer prVar12;
  ostream *poVar13;
  anon_union_8_1_a8a14541_for_iterator_2 *paVar14;
  anon_union_8_1_a8a14541_for_iterator_2 aVar15;
  size_type sVar16;
  anon_union_8_1_a8a14541_for_iterator_2 in_R8;
  pointer ppFVar17;
  Options *pOVar18;
  string_view path;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_01;
  string other_package_for_prefix;
  size_type __dnew;
  const_iterator i;
  string lookup_key;
  const_iterator package_match;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  expected_package_prefixes;
  anon_union_8_1_a8a14541_for_iterator_2 local_1d8;
  anon_union_8_1_a8a14541_for_iterator_2 local_1d0;
  undefined1 local_1c8 [24];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [32];
  undefined1 local_180 [24];
  undefined1 local_168 [48];
  char *local_138;
  undefined8 local_130;
  AlphaNum *local_128;
  undefined8 local_120;
  char *local_118;
  anon_union_8_1_a8a14541_for_iterator_2 local_110;
  anon_union_8_1_a8a14541_for_iterator_2 local_108;
  undefined8 local_100;
  char *local_f8;
  AlphaNum *local_f0;
  AlphaNum *local_e8;
  undefined8 local_e0;
  char *local_d8;
  AlphaNum *local_d0;
  undefined1 local_c8 [32];
  AlphaNum local_a8;
  Options *local_78;
  iterator local_70;
  pointer local_60;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  
  iVar9 = std::__cxx11::string::compare((char *)validation_options);
  if (iVar9 == 0) {
    return true;
  }
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  sVar16 = (validation_options->expected_prefixes_path)._M_string_length;
  local_78 = validation_options;
  if (sVar16 != 0) {
    pcVar2 = (validation_options->expected_prefixes_path)._M_dataplus._M_p;
    local_180._8_8_ = (slot_type *)local_168;
    local_180._0_8_ = &PTR__PackageToPrefixesCollector_0190e988;
    local_1b0._0_8_ = (anon_union_8_1_a8a14541_for_iterator_2)0x11;
    aVar10.slot_ = (slot_type *)
                   std::__cxx11::string::_M_create((ulong *)(local_180 + 8),(ulong)local_1b0);
    local_168._0_8_ = local_1b0._0_8_;
    *(undefined8 *)aVar10.slot_ = 0x6465746365707845;
    builtin_strncpy((char *)((long)aVar10.slot_ + 8)," prefixe",8);
    *(char *)((long)aVar10.slot_ + 0x10) = 's';
    local_180._16_8_ = local_1b0._0_8_;
    *(char *)((long)aVar10.slot_ + local_1b0._0_8_) = '\0';
    local_168._16_8_ = &local_58;
    path._M_str = pcVar2;
    path._M_len = sVar16;
    local_180._8_8_ = aVar10.slot_;
    bVar6 = ParseSimpleFile(path,(LineConsumer *)local_180,out_error);
    local_180._0_8_ = &PTR__PackageToPrefixesCollector_0190e988;
    if ((slot_type *)local_180._8_8_ != (slot_type *)local_168) {
      operator_delete((void *)local_180._8_8_,(ulong)(local_168._0_8_ + 1));
    }
    if (!bVar6) {
LAB_00e02626:
      bVar6 = false;
      goto LAB_00e0262c;
    }
  }
  ppFVar17 = (files->
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (files->
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = true;
  if (ppFVar17 != local_60) {
    pOVar18 = local_78;
    do {
      pFVar3 = *ppFVar17;
      local_180._8_8_ = ((anon_union_8_1_a8a14541_for_iterator_2 *)pFVar3->name_)->slot_;
      local_180._0_8_ = ((anon_union_8_1_a8a14541_for_iterator_2 *)pFVar3->name_)[1].slot_;
      _Var11 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::basic_string_view<char,std::char_traits<char>>const>>
                         ((pOVar18->expected_prefixes_suppressions).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (pOVar18->expected_prefixes_suppressions).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,local_180);
      if (_Var11._M_current ==
          (pOVar18->expected_prefixes_suppressions).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_d0 = (AlphaNum *)(pOVar18->expected_prefixes_path)._M_dataplus._M_p;
        local_1c8._16_8_ = (pOVar18->expected_prefixes_path)._M_string_length;
        bVar6 = pOVar18->prefixes_must_be_registered;
        bVar8 = pOVar18->require_prefixes;
        uVar1 = *(uint *)((long)&pFVar3->options_->field_0 + 0x18);
        paVar14 = (anon_union_8_1_a8a14541_for_iterator_2 *)
                  ((ulong)(pFVar3->options_->field_0)._impl_.objc_class_prefix_.tagged_ptr_.ptr_ &
                  0xfffffffffffffffc);
        aVar10 = (anon_union_8_1_a8a14541_for_iterator_2)paVar14->slot_;
        aVar15 = (anon_union_8_1_a8a14541_for_iterator_2)paVar14[1].slot_;
        _Var4._M_p = (pFVar3->package_->_M_dataplus)._M_p;
        sVar16 = pFVar3->package_->_M_string_length;
        if (sVar16 == 0) {
          local_180._8_8_ = "no_package:";
          local_180._0_8_ = &DAT_0000000b;
          local_1b0._8_8_ = ((anon_union_8_1_a8a14541_for_iterator_2 *)pFVar3->name_)->slot_;
          local_1b0._0_8_ = ((anon_union_8_1_a8a14541_for_iterator_2 *)pFVar3->name_)[1];
          absl::lts_20250127::StrCat_abi_cxx11_
                    ((string *)local_c8,(lts_20250127 *)local_180,(AlphaNum *)local_1b0,
                     (AlphaNum *)local_1b0._8_8_);
        }
        else {
          local_c8._0_8_ = local_c8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c8,_Var4._M_p,_Var4._M_p + sVar16);
        }
        local_70 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   ::find<std::__cxx11::string>
                             ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                               *)&local_58,(key_arg<std::__cxx11::basic_string<char>_> *)local_c8);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::AssertNotDebugCapacity(&local_58);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_180._8_8_;
        local_180._0_16_ = auVar5 << 0x40;
        bVar7 = absl::lts_20250127::container_internal::operator==(&local_70,(iterator *)local_180);
        if (bVar7) {
          if ((uVar1 & 8) == 0) {
            bVar6 = true;
            if (bVar8 != false) {
              local_180._8_8_ = "error: \'";
              local_180._0_8_ = &DAT_00000008;
              local_1b0._8_8_ = *(anon_union_8_1_a8a14541_for_iterator_2 *)pFVar3->name_;
              local_1b0._0_8_ = ((anon_union_8_1_a8a14541_for_iterator_2 *)pFVar3->name_)[1];
              local_a8.piece_._M_len = 0x36;
              local_a8.piece_._M_str = "\' does not have a required \'option objc_class_prefix\'.";
              absl::lts_20250127::StrCat_abi_cxx11_
                        ((string *)&local_1d8,(lts_20250127 *)local_180,(AlphaNum *)local_1b0,
                         &local_a8,(AlphaNum *)in_R8.slot_);
              std::__cxx11::string::operator=((string *)out_error,(string *)&local_1d8);
LAB_00e02095:
              aVar10 = in_R8;
              if (local_1d8.slot_ != (slot_type *)local_1c8) {
                sVar16 = CONCAT71(local_1c8._1_7_,local_1c8[0]);
                aVar15 = local_1d8;
LAB_00e020a9:
                operator_delete(aVar15.slot_,sVar16 + 1);
              }
              goto LAB_00e020b1;
            }
          }
          else {
            if (((AlphaNum *)local_1c8._16_8_ != (AlphaNum *)0x0) &&
               (aVar15.slot_ != (slot_type *)0x0)) {
              local_1d8.slot_ = (slot_type *)local_1c8;
              local_1d0.slot_ = (slot_type *)0x0;
              local_1c8[0] = 0;
              local_180._0_16_ =
                   (undefined1  [16])
                   absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::begin(&local_58);
              while( true ) {
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::AssertNotDebugCapacity(&local_58);
                local_1b0._0_8_ = (slot_type *)0x0;
                bVar8 = absl::lts_20250127::container_internal::operator==
                                  ((iterator *)local_180,(iterator *)local_1b0);
                if (bVar8) break;
                prVar12 = absl::lts_20250127::container_internal::
                          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::iterator::operator->((iterator *)local_180);
                if (((slot_type *)(prVar12->second)._M_string_length == aVar15.slot_) &&
                   (iVar9 = bcmp((prVar12->second)._M_dataplus._M_p,aVar10.slot_,(size_t)aVar15),
                   iVar9 == 0)) {
                  absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::iterator::operator->((iterator *)local_180);
                  std::__cxx11::string::_M_assign((string *)&local_1d8);
                  if (local_1d0.slot_ < (slot_type *)&DAT_0000000b) break;
                  if (*(long *)((long)local_1d8.slot_ + 3) != 0x3a6567616b636170 ||
                      *(long *)local_1d8.slot_ != 0x616b6361705f6f6e) goto LAB_00e01e6f;
                }
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::iterator::operator++((iterator *)local_180);
              }
              if (local_1d0.slot_ != (slot_type *)0x0) {
LAB_00e01e6f:
                local_168._32_8_ = (pFVar3->name_->_M_dataplus)._M_p;
                local_168._24_8_ = pFVar3->name_->_M_string_length;
                local_180._0_8_ = &DAT_0000002a;
                local_180._8_8_ = "error: Found \'option objc_class_prefix = \"";
                local_168._8_8_ = 8;
                local_168._16_8_ = "\";\' in \'";
                local_168._40_8_ = 0x23;
                local_138 = "\'; that prefix is already used for ";
                pieces._M_len = local_168._32_8_;
                pieces._M_array = (iterator)&DAT_00000005;
                local_180._16_8_ = aVar15;
                local_168._0_8_ = aVar10;
                absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                          ((string *)local_1b0,(strings_internal *)local_180,pieces);
                std::__cxx11::string::operator=((string *)out_error,(string *)local_1b0);
                if ((slot_type *)local_1b0._0_8_ != (slot_type *)(local_1b0 + 0x10)) {
                  operator_delete((void *)local_1b0._0_8_,local_1a0._0_8_ + 1);
                }
                if ((local_1d0.slot_ < (slot_type *)&DAT_0000000b) ||
                   (*(long *)((long)local_1d8.slot_ + 3) != 0x3a6567616b636170 ||
                    *(long *)local_1d8.slot_ != 0x616b6361705f6f6e)) {
                  local_180._0_8_ = &DAT_00000009;
                  local_180._8_8_ = "\'package ";
                  local_1b0._0_8_ = local_1d0;
                  local_1b0._8_8_ = local_1d8;
                  local_a8.piece_._M_len = 3;
                  local_a8.piece_._M_str = ";\'.";
                  absl::lts_20250127::StrAppend
                            (out_error,(AlphaNum *)local_180,(AlphaNum *)local_1b0,&local_a8);
                }
                else {
                  local_180._0_8_ = &DAT_00000006;
                  local_180._8_8_ = "file \'";
                  in_R8.slot_ = (slot_type *)((long)local_1d8.slot_ + 0xb);
                  local_1b0._0_8_ = (slot_type *)((long)local_1d0.slot_ + -0xb);
                  if (*(long *)((long)local_1d8.slot_ + 3) != 0x3a6567616b636170 ||
                      *(long *)local_1d8.slot_ != 0x616b6361705f6f6e) {
                    in_R8 = local_1d8;
                    local_1b0._0_8_ = local_1d0;
                  }
                  local_a8.piece_._M_len = 2;
                  local_a8.piece_._M_str = "\'.";
                  local_1b0._8_8_ = in_R8;
                  absl::lts_20250127::StrAppend
                            (out_error,(AlphaNum *)local_180,(AlphaNum *)local_1b0,&local_a8);
                }
                local_180._8_8_ = " It can only be reused by adding \'";
                local_180._0_8_ = (ctrl_t *)0x22;
                local_180._16_8_ = local_c8._8_8_;
                local_168._0_8_ = local_c8._0_8_;
                local_168._8_8_ = 3;
                local_168._16_8_ =
                     (long)
                     "private static readonly pb::FieldCodec<$type_name$> _repeated_$name$_codec\n    = "
                     + 0x4e;
                local_168._40_8_ = 0x21;
                local_138 = "\' to the expected prefixes file (";
                local_130 = local_1c8._16_8_;
                local_128 = local_d0;
                local_120 = 2;
                local_118 = ").";
                pieces_00._M_len = local_c8._8_8_;
                pieces_00._M_array = (iterator)&DAT_00000007;
                local_168._24_8_ = aVar15;
                local_168._32_8_ = aVar10;
                absl::lts_20250127::strings_internal::AppendPieces
                          ((strings_internal *)out_error,(Nonnull<std::string_*>)local_180,pieces_00
                          );
                goto LAB_00e02095;
              }
              if (local_1d8.slot_ != (slot_type *)local_1c8) {
                operator_delete(local_1d8.slot_,CONCAT71(local_1c8._1_7_,local_1c8[0]) + 1);
              }
            }
            if (aVar15.slot_ != (slot_type *)0x0) {
              if (0x19 < (byte)(*(char *)aVar10.slot_ + 0xbfU)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "protoc:0: warning: Invalid \'option objc_class_prefix = \"",0x38);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,(char *)aVar10.slot_,(long)aVar15);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\";\' in \'",8);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,(pFVar3->name_->_M_dataplus)._M_p,
                                     pFVar3->name_->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\';",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13," it should start with a capital letter.",0x27);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
                std::ostream::put((char)poVar13);
                std::ostream::flush();
                std::ostream::flush();
              }
              if (aVar15.slot_ < (slot_type *)0x3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "protoc:0: warning: Invalid \'option objc_class_prefix = \"",0x38);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,(char *)aVar10.slot_,(long)aVar15);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\";\' in \'",8);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,(pFVar3->name_->_M_dataplus)._M_p,
                                     pFVar3->name_->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\';",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13," Apple recommends they should be at least 3 characters long.",
                           0x3c);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
                std::ostream::put((char)poVar13);
                std::ostream::flush();
                std::ostream::flush();
              }
            }
            if ((AlphaNum *)local_1c8._16_8_ == (AlphaNum *)0x0) {
              bVar6 = true;
            }
            else {
              if (bVar6 != false) {
                local_168._0_8_ = (pFVar3->name_->_M_dataplus)._M_p;
                local_180._16_8_ = pFVar3->name_->_M_string_length;
                local_108 = aVar10;
                if (aVar15.slot_ == (slot_type *)0x0) {
                  local_108.slot_ = (slot_type *)0x1093135;
                }
                local_180._8_8_ = "error: \'";
                local_180._0_8_ = &DAT_00000008;
                local_168._8_8_ = 0x23;
                local_168._16_8_ = "\' has \'option objc_class_prefix = \"";
                local_110 = aVar15;
                if (aVar15.slot_ == (slot_type *)0x0) {
                  local_110 = (anon_union_8_1_a8a14541_for_iterator_2)0x2;
                }
                local_168._40_8_ = 0x24;
                local_138 = "\";\', but it is not registered. Add \'";
                local_130 = local_c8._8_8_;
                local_128 = (AlphaNum *)local_c8._0_8_;
                local_120 = 3;
                local_118 = " = ";
                local_100 = 0x21;
                local_f8 = "\' to the expected prefixes file (";
                local_f0 = (AlphaNum *)local_1c8._16_8_;
                local_e8 = local_d0;
                local_e0 = 2;
                local_d8 = ").";
                pieces_01._M_len = local_c8._8_8_;
                pieces_01._M_array = (iterator)&DAT_0000000b;
                local_168._24_8_ = aVar15;
                local_168._32_8_ = aVar10;
                absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                          ((string *)local_1b0,(strings_internal *)local_180,pieces_01);
                std::__cxx11::string::operator=((string *)out_error,(string *)local_1b0);
                sVar16 = local_1a0._0_8_;
                aVar15 = (anon_union_8_1_a8a14541_for_iterator_2)local_1b0._0_8_;
                if ((slot_type *)local_1b0._0_8_ != (slot_type *)(local_1b0 + 0x10))
                goto LAB_00e020a9;
                goto LAB_00e020b1;
              }
              bVar6 = true;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "protoc:0: warning: Found unexpected \'option objc_class_prefix = \"",0x41)
              ;
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,(char *)aVar10.slot_,(long)aVar15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\";\' in \'",8);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,(pFVar3->name_->_M_dataplus)._M_p,
                                   pFVar3->name_->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,"\'; consider adding \'",0x14);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,(char *)local_c8._0_8_,local_c8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13," = ",3);
              if (aVar15.slot_ == (slot_type *)0x0) {
                aVar10.slot_ = (slot_type *)0x1093135;
                aVar15 = (anon_union_8_1_a8a14541_for_iterator_2)0x2;
              }
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,(char *)aVar10.slot_,(long)aVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,"\' to the expected prefixes file (",0x21);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,(char *)local_d0,local_1c8._16_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,").",2);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
              std::ostream::put((char)poVar13);
              std::ostream::flush();
              std::ostream::flush();
            }
          }
        }
        else if ((((uVar1 & 8) == 0) ||
                 (prVar12 = absl::lts_20250127::container_internal::
                            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::iterator::operator->(&local_70),
                 (slot_type *)(prVar12->second)._M_string_length != aVar15.slot_)) ||
                ((bVar6 = true, aVar15.slot_ != (slot_type *)0x0 &&
                 (iVar9 = bcmp((prVar12->second)._M_dataplus._M_p,aVar10.slot_,(size_t)aVar15),
                 iVar9 != 0)))) {
          local_180._0_8_ = &DAT_0000002d;
          local_180._8_8_ = "error: Expected \'option objc_class_prefix = \"";
          prVar12 = absl::lts_20250127::container_internal::
                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::iterator::operator->(&local_70);
          local_1b0._8_8_ = (prVar12->second)._M_dataplus._M_p;
          local_1b0._0_8_ = (prVar12->second)._M_string_length;
          local_a8.piece_._M_len = 3;
          local_a8.piece_._M_str = "\";\'";
          absl::lts_20250127::StrCat_abi_cxx11_
                    ((string *)&local_1d8,(lts_20250127 *)local_180,(AlphaNum *)local_1b0,&local_a8,
                     (AlphaNum *)in_R8.slot_);
          std::__cxx11::string::operator=((string *)out_error,(string *)&local_1d8);
          if (local_1d8.slot_ != (slot_type *)local_1c8) {
            operator_delete(local_1d8.slot_,CONCAT71(local_1c8._1_7_,local_1c8[0]) + 1);
          }
          if (sVar16 != 0) {
            local_180._0_8_ = (_func_int **)0xe;
            local_180._8_8_ = " for package \'";
            local_a8.piece_._M_len = 1;
            local_a8.piece_._M_str = "\'";
            local_1b0._0_8_ = sVar16;
            local_1b0._8_8_ = _Var4._M_p;
            absl::lts_20250127::StrAppend
                      (out_error,(AlphaNum *)local_180,(AlphaNum *)local_1b0,&local_a8);
          }
          local_180._0_8_ = &DAT_00000005;
          local_180._8_8_ = " in \'";
          local_1b0._8_8_ = *(anon_union_8_1_a8a14541_for_iterator_2 *)pFVar3->name_;
          local_1b0._0_8_ = ((anon_union_8_1_a8a14541_for_iterator_2 *)pFVar3->name_)[1];
          local_a8.piece_._M_len = 1;
          local_a8.piece_._M_str = "\'";
          absl::lts_20250127::StrAppend
                    (out_error,(AlphaNum *)local_180,(AlphaNum *)local_1b0,&local_a8);
          if ((uVar1 & 8) != 0) {
            local_180._0_8_ = &DAT_0000000d;
            local_180._8_8_ = "; but found \'";
            local_a8.piece_._M_len = 9;
            local_a8.piece_._M_str = "\' instead";
            local_1b0._0_8_ = aVar15;
            local_1b0._8_8_ = aVar10;
            absl::lts_20250127::StrAppend
                      (out_error,(AlphaNum *)local_180,(AlphaNum *)local_1b0,&local_a8);
          }
          aVar10 = in_R8;
          local_180._8_8_ = (slot_type *)0x13904b6;
          local_180._0_8_ = (ctrl_t *)0x1;
          absl::lts_20250127::StrAppend(out_error,(AlphaNum *)local_180);
LAB_00e020b1:
          bVar6 = false;
          in_R8 = aVar10;
        }
        if ((AlphaNum *)local_c8._0_8_ != (AlphaNum *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
        pOVar18 = local_78;
        if (!bVar6) goto LAB_00e02626;
      }
      ppFVar17 = ppFVar17 + 1;
    } while (ppFVar17 != local_60);
    bVar6 = true;
  }
LAB_00e0262c:
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set(&local_58);
  return bVar6;
}

Assistant:

bool ValidateObjCClassPrefixes(const std::vector<const FileDescriptor*>& files,
                               const Options& validation_options,
                               std::string* out_error) {
  // Allow a '-' as the path for the expected prefixes to completely disable
  // even the most basic of checks.
  if (validation_options.expected_prefixes_path == "-") {
    return true;
  }

  // Load the expected package prefixes, if available, to validate against.
  absl::flat_hash_map<std::string, std::string> expected_package_prefixes;
  if (!LoadExpectedPackagePrefixes(validation_options.expected_prefixes_path,
                                   &expected_package_prefixes, out_error)) {
    return false;
  }

  for (auto file : files) {
    bool should_skip =
        (std::find(validation_options.expected_prefixes_suppressions.begin(),
                   validation_options.expected_prefixes_suppressions.end(),
                   file->name()) !=
         validation_options.expected_prefixes_suppressions.end());
    if (should_skip) {
      continue;
    }

    bool is_valid =
        ValidateObjCClassPrefix(file, validation_options.expected_prefixes_path,
                                expected_package_prefixes,
                                validation_options.prefixes_must_be_registered,
                                validation_options.require_prefixes, out_error);
    if (!is_valid) {
      return false;
    }
  }
  return true;
}